

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawElementsBaseVertexTests.cpp
# Opt level: O2

string * __thiscall
glcts::DrawElementsBaseVertexTestBase::getFunctionName_abi_cxx11_
          (string *__return_storage_ptr__,DrawElementsBaseVertexTestBase *this,
          _function_type function_type)

{
  TestError *this_00;
  allocator<char> local_21;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"[?]",&local_21);
  switch(function_type) {
  case FUNCTION_GL_DRAW_ELEMENTS_BASE_VERTEX:
    (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    break;
  case FUNCTION_GL_DRAW_ELEMENTS_INSTANCED_BASE_VERTEX:
    (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    break;
  case FUNCTION_GL_DRAW_RANGE_ELEMENTS_BASE_VERTEX:
    (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    break;
  case FUNCTION_GL_MULTI_DRAW_ELEMENTS_BASE_VERTEX:
    (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unknown function type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/draw_elements_base_vertex/esextcDrawElementsBaseVertexTests.cpp"
               ,0x393);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::assign((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string DrawElementsBaseVertexTestBase::getFunctionName(_function_type function_type)
{
	std::string result = "[?]";

	switch (function_type)
	{
	case FUNCTION_GL_DRAW_ELEMENTS_BASE_VERTEX:
	{
		if (glu::isContextTypeES(m_context.getRenderContext().getType()))
		{
			result = "glDrawElementsBaseVertexEXT()";

			break;
		}
		else
		{
			result = "glDrawElementsBaseVertex()";

			break;
		}

		break;
	}

	case FUNCTION_GL_DRAW_ELEMENTS_INSTANCED_BASE_VERTEX:
	{
		if (glu::isContextTypeES(m_context.getRenderContext().getType()))
		{
			result = "glDrawElementsInstancedBaseVertexEXT()";

			break;
		}
		else
		{
			result = "glDrawElementsInstancedBaseVertex()";

			break;
		}

		break;
	}

	case FUNCTION_GL_DRAW_RANGE_ELEMENTS_BASE_VERTEX:
	{
		if (glu::isContextTypeES(m_context.getRenderContext().getType()))
		{
			result = "glDrawRangeElementsBaseVertexEXT()";

			break;
		}
		else
		{
			result = "glDrawRangeElementsBaseVertex()";

			break;
		}

		break;
	}

	case FUNCTION_GL_MULTI_DRAW_ELEMENTS_BASE_VERTEX:
	{
		if (glu::isContextTypeES(m_context.getRenderContext().getType()))
		{
			result = "glMultiDrawElementsBaseVertexEXT()";

			break;
		}
		else
		{
			result = "glMultiDrawElementsBaseVertex()";

			break;
		}

		break;
	}

	default:
	{
		TCU_FAIL("Unknown function type");

		break;
	}
	} /* switch (function_type) */

	return result;
}